

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O3

void mbedtls_aesni_gcm_mult(uchar *c,uchar *a,uchar *b)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [16];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [11];
  undefined1 auVar65 [15];
  undefined1 auVar66 [11];
  undefined1 auVar67 [15];
  undefined1 auVar68 [11];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [11];
  undefined1 auVar81 [16];
  undefined1 auVar76 [11];
  undefined1 auVar82 [16];
  undefined1 auVar77 [11];
  undefined1 auVar83 [16];
  ulong uVar84;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  undefined1 auVar91 [16];
  ulong uVar95;
  uchar cc [16];
  uchar bb [16];
  uchar aa [16];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  ulong uVar85;
  
  auVar81 = *(undefined1 (*) [16])a;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar81._0_13_;
  auVar42[0xe] = auVar81[7];
  auVar46[0xc] = auVar81[6];
  auVar46._0_12_ = auVar81._0_12_;
  auVar46._13_2_ = auVar42._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar81._0_11_;
  auVar49._12_3_ = auVar46._12_3_;
  auVar52[10] = auVar81[5];
  auVar52._0_10_ = auVar81._0_10_;
  auVar52._11_4_ = auVar49._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar81._0_9_;
  auVar55._10_5_ = auVar52._10_5_;
  auVar58[8] = auVar81[4];
  auVar58._0_8_ = auVar81._0_8_;
  auVar58._9_6_ = auVar55._9_6_;
  auVar86[7] = 0;
  auVar86._0_7_ = auVar58._8_7_;
  auVar63._7_8_ = 0;
  auVar63._0_7_ = auVar58._8_7_;
  auVar69._1_8_ = SUB158(auVar63 << 0x40,7);
  auVar69[0] = auVar81[3];
  auVar69._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar69 << 0x30,5);
  auVar64[0] = auVar81[2];
  auVar70._11_4_ = 0;
  auVar70._0_11_ = auVar64;
  auVar62._3_12_ = SUB1512(auVar70 << 0x20,3);
  auVar62[2] = auVar81[1];
  auVar62[1] = 0;
  auVar62[0] = auVar81[0];
  auVar86._8_4_ = auVar62._0_4_;
  auVar86._12_4_ = auVar64._0_4_;
  auVar87 = pshuflw(auVar86,auVar86,0x1b);
  auVar88 = pshufhw(auVar87,auVar87,0x1b);
  auVar90[8] = auVar81[8];
  auVar90[9] = 0;
  auVar90[10] = auVar81[9];
  auVar75._0_10_ = (unkuint10)auVar81[0xc] << 0x40;
  auVar75[10] = auVar81[0xd];
  auVar78[0xb] = 0;
  auVar78._0_11_ = auVar75;
  auVar78[0xc] = auVar81[0xe];
  auVar78[0xd] = 0;
  auVar78[0xe] = auVar81[0xf];
  auVar90[3] = 0;
  auVar90._0_3_ = auVar75._8_3_;
  auVar90._4_3_ = auVar78._12_3_;
  auVar90[7] = 0;
  auVar90[0xb] = 0;
  auVar90._12_3_ = (int3)(CONCAT16(auVar81[0xb],(uint6)auVar81[10] << 0x20) >> 0x20);
  auVar90[0xf] = 0;
  auVar81 = pshuflw(auVar90,auVar90,0x1b);
  auVar87 = pshufhw(auVar81,auVar81,0x1b);
  sVar1 = auVar87._0_2_;
  sVar3 = auVar87._2_2_;
  sVar5 = auVar87._4_2_;
  sVar7 = auVar87._6_2_;
  sVar9 = auVar87._8_2_;
  sVar11 = auVar87._10_2_;
  sVar13 = auVar87._12_2_;
  sVar15 = auVar87._14_2_;
  sVar17 = auVar88._0_2_;
  sVar19 = auVar88._2_2_;
  sVar21 = auVar88._4_2_;
  sVar23 = auVar88._6_2_;
  sVar25 = auVar88._8_2_;
  sVar27 = auVar88._10_2_;
  sVar29 = auVar88._12_2_;
  sVar31 = auVar88._14_2_;
  auVar81 = *(undefined1 (*) [16])b;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar81._0_13_;
  auVar40[0xe] = auVar81[7];
  auVar43[0xc] = auVar81[6];
  auVar43._0_12_ = auVar81._0_12_;
  auVar43._13_2_ = auVar40._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar81._0_11_;
  auVar47._12_3_ = auVar43._12_3_;
  auVar50[10] = auVar81[5];
  auVar50._0_10_ = auVar81._0_10_;
  auVar50._11_4_ = auVar47._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar81._0_9_;
  auVar53._10_5_ = auVar50._10_5_;
  auVar56[8] = auVar81[4];
  auVar56._0_8_ = auVar81._0_8_;
  auVar56._9_6_ = auVar53._9_6_;
  auVar89[7] = 0;
  auVar89._0_7_ = auVar56._8_7_;
  auVar65._7_8_ = 0;
  auVar65._0_7_ = auVar56._8_7_;
  auVar71._1_8_ = SUB158(auVar65 << 0x40,7);
  auVar71[0] = auVar81[3];
  auVar71._9_6_ = 0;
  auVar66._1_10_ = SUB1510(auVar71 << 0x30,5);
  auVar66[0] = auVar81[2];
  auVar72._11_4_ = 0;
  auVar72._0_11_ = auVar66;
  auVar59[2] = auVar81[1];
  auVar59._0_2_ = auVar81._0_2_;
  auVar59._3_12_ = SUB1512(auVar72 << 0x20,3);
  auVar60._2_13_ = auVar59._2_13_;
  auVar60._0_2_ = auVar81._0_2_ & 0xff;
  auVar89._8_4_ = auVar60._0_4_;
  auVar89._12_4_ = auVar66._0_4_;
  auVar90 = pshuflw(auVar89,auVar89,0x1b);
  auVar90 = pshufhw(auVar90,auVar90,0x1b);
  auVar82[8] = auVar81[8];
  auVar82[9] = 0;
  auVar82[10] = auVar81[9];
  auVar76._0_10_ = (unkuint10)auVar81[0xc] << 0x40;
  auVar76[10] = auVar81[0xd];
  auVar79[0xb] = 0;
  auVar79._0_11_ = auVar76;
  auVar79[0xc] = auVar81[0xe];
  auVar79[0xd] = 0;
  auVar79[0xe] = auVar81[0xf];
  auVar82[3] = 0;
  auVar82._0_3_ = auVar76._8_3_;
  auVar82._4_3_ = auVar79._12_3_;
  auVar82[7] = 0;
  auVar82[0xb] = 0;
  auVar82._12_3_ = (int3)(CONCAT16(auVar81[0xb],(uint6)auVar81[10] << 0x20) >> 0x20);
  auVar82[0xf] = 0;
  auVar81 = pshuflw(auVar82,auVar82,0x1b);
  auVar81 = pshufhw(auVar81,auVar81,0x1b);
  sVar2 = auVar81._0_2_;
  sVar4 = auVar81._2_2_;
  sVar6 = auVar81._4_2_;
  sVar8 = auVar81._6_2_;
  sVar10 = auVar81._8_2_;
  sVar12 = auVar81._10_2_;
  sVar14 = auVar81._12_2_;
  sVar16 = auVar81._14_2_;
  sVar18 = auVar90._0_2_;
  sVar20 = auVar90._2_2_;
  sVar22 = auVar90._4_2_;
  sVar24 = auVar90._6_2_;
  sVar26 = auVar90._8_2_;
  sVar28 = auVar90._10_2_;
  sVar30 = auVar90._12_2_;
  sVar32 = auVar90._14_2_;
  uVar92 = CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar87[0xe] - (0xff < sVar15),
                    CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar87[0xc] - (0xff < sVar13),
                             CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar87[10] -
                                      (0xff < sVar11),
                                      CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar87[8] -
                                               (0xff < sVar9),
                                               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar87[6] -
                                                        (0xff < sVar7),
                                                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar87[4] - (0xff < sVar5),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar87[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar1) *
                                                                          (sVar1 < 0x100) *
                                                                          auVar87[0] -
                                                                          (0xff < sVar1))))))));
  uVar93 = CONCAT17((0 < sVar31) * (sVar31 < 0x100) * auVar88[0xe] - (0xff < sVar31),
                    CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar88[0xc] - (0xff < sVar29),
                             CONCAT15((0 < sVar27) * (sVar27 < 0x100) * auVar88[10] -
                                      (0xff < sVar27),
                                      CONCAT14((0 < sVar25) * (sVar25 < 0x100) * auVar88[8] -
                                               (0xff < sVar25),
                                               CONCAT13((0 < sVar23) * (sVar23 < 0x100) * auVar88[6]
                                                        - (0xff < sVar23),
                                                        CONCAT12((0 < sVar21) * (sVar21 < 0x100) *
                                                                 auVar88[4] - (0xff < sVar21),
                                                                 CONCAT11((0 < sVar19) *
                                                                          (sVar19 < 0x100) *
                                                                          auVar88[2] -
                                                                          (0xff < sVar19),
                                                                          (0 < sVar17) *
                                                                          (sVar17 < 0x100) *
                                                                          auVar88[0] -
                                                                          (0xff < sVar17))))))));
  uVar84 = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar81[0xe] - (0xff < sVar16),
                    CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar81[0xc] - (0xff < sVar14),
                             CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar81[10] -
                                      (0xff < sVar12),
                                      CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar81[8] -
                                               (0xff < sVar10),
                                               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar81[6] -
                                                        (0xff < sVar8),
                                                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                 auVar81[4] - (0xff < sVar6),
                                                                 CONCAT11((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar81[2] -
                                                                          (0xff < sVar4),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar81[0] -
                                                                          (0xff < sVar2))))))));
  uVar85 = CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar90[0xe] - (0xff < sVar32),
                    CONCAT16((0 < sVar30) * (sVar30 < 0x100) * auVar90[0xc] - (0xff < sVar30),
                             CONCAT15((0 < sVar28) * (sVar28 < 0x100) * auVar90[10] -
                                      (0xff < sVar28),
                                      CONCAT14((0 < sVar26) * (sVar26 < 0x100) * auVar90[8] -
                                               (0xff < sVar26),
                                               CONCAT13((0 < sVar24) * (sVar24 < 0x100) * auVar90[6]
                                                        - (0xff < sVar24),
                                                        CONCAT12((0 < sVar22) * (sVar22 < 0x100) *
                                                                 auVar90[4] - (0xff < sVar22),
                                                                 CONCAT11((0 < sVar20) *
                                                                          (sVar20 < 0x100) *
                                                                          auVar90[2] -
                                                                          (0xff < sVar20),
                                                                          (0 < sVar18) *
                                                                          (sVar18 < 0x100) *
                                                                          auVar90[0] -
                                                                          (0xff < sVar18))))))));
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar84;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar92;
  auVar81 = (undefined1  [16])0x0;
  for (uVar33 = 0; uVar33 < 0x40; uVar33 = uVar33 + 1) {
    if ((auVar87 & (undefined1  [16])0x1 << uVar33) != (undefined1  [16])0x0) {
      auVar81 = auVar81 ^ auVar88 << uVar33;
    }
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar85;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar93;
  auVar87 = (undefined1  [16])0x0;
  for (uVar33 = 0; uVar33 < 0x40; uVar33 = uVar33 + 1) {
    if ((auVar38 & (undefined1  [16])0x1 << uVar33) != (undefined1  [16])0x0) {
      auVar87 = auVar87 ^ auVar39 << uVar33;
    }
  }
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar84;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar93;
  auVar88 = (undefined1  [16])0x0;
  for (uVar33 = 0; uVar33 < 0x40; uVar33 = uVar33 + 1) {
    if ((auVar36 & (undefined1  [16])0x1 << uVar33) != (undefined1  [16])0x0) {
      auVar88 = auVar88 ^ auVar37 << uVar33;
    }
  }
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar85;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar92;
  auVar90 = (undefined1  [16])0x0;
  for (uVar33 = 0; uVar33 < 0x40; uVar33 = uVar33 + 1) {
    if ((auVar34 & (undefined1  [16])0x1 << uVar33) != (undefined1  [16])0x0) {
      auVar90 = auVar90 ^ auVar35 << uVar33;
    }
  }
  auVar44._8_8_ = 0;
  auVar44._0_8_ = SUB168(auVar90 ^ auVar88,0);
  auVar87 = auVar87 ^ (auVar90 ^ auVar88) >> 0x40;
  auVar81 = auVar81 ^ auVar44 << 0x40;
  uVar85 = auVar81._0_8_;
  uVar92 = auVar81._8_8_;
  uVar84 = uVar85 << 1;
  uVar95 = auVar87._0_8_;
  uVar93 = uVar92 << 1 | uVar85 >> 0x3f;
  uVar94 = uVar93 ^ uVar85 << 0x3f ^ uVar85 << 0x3a;
  uVar84 = uVar85 & 0x7fffffffffffffff ^ uVar84 >> 2 ^ uVar84 >> 7 ^
           (uVar85 >> 0x3f) << 0x3f ^ uVar93 << 0x3e ^ uVar93 << 0x39 ^ uVar84 ^
           (uVar95 << 1 | uVar92 >> 0x3f);
  uVar85 = uVar94 >> 1 ^ uVar94 >> 2 ^ uVar94 >> 7 ^ uVar94 ^ (auVar87._8_8_ << 1 | uVar95 >> 0x3f);
  auVar81._8_8_ = uVar85;
  auVar81._0_8_ = uVar84;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar81._0_13_;
  auVar41[0xe] = (char)(uVar84 >> 0x38);
  auVar45[0xc] = (char)(uVar84 >> 0x30);
  auVar45._0_12_ = auVar81._0_12_;
  auVar45._13_2_ = auVar41._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar81._0_11_;
  auVar48._12_3_ = auVar45._12_3_;
  auVar51[10] = (char)(uVar84 >> 0x28);
  auVar51._0_10_ = auVar81._0_10_;
  auVar51._11_4_ = auVar48._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar81._0_9_;
  auVar54._10_5_ = auVar51._10_5_;
  auVar57[8] = (char)(uVar84 >> 0x20);
  auVar57._0_8_ = uVar84;
  auVar57._9_6_ = auVar54._9_6_;
  auVar91[7] = 0;
  auVar91._0_7_ = auVar57._8_7_;
  auVar67._7_8_ = 0;
  auVar67._0_7_ = auVar57._8_7_;
  auVar73._1_8_ = SUB158(auVar67 << 0x40,7);
  auVar73[0] = (char)(uVar84 >> 0x18);
  auVar73._9_6_ = 0;
  auVar68._1_10_ = SUB1510(auVar73 << 0x30,5);
  auVar68[0] = (char)(uVar84 >> 0x10);
  auVar74._11_4_ = 0;
  auVar74._0_11_ = auVar68;
  auVar61._3_12_ = SUB1512(auVar74 << 0x20,3);
  auVar61[2] = (char)(uVar84 >> 8);
  auVar61[1] = 0;
  auVar61[0] = (byte)uVar84;
  auVar91._8_4_ = auVar61._0_4_;
  auVar91._12_4_ = auVar68._0_4_;
  auVar81 = pshuflw(auVar91,auVar91,0x1b);
  auVar87 = pshufhw(auVar81,auVar81,0x1b);
  auVar83[8] = (byte)uVar85;
  auVar83[9] = 0;
  auVar83[10] = (char)(uVar85 >> 8);
  auVar77._0_10_ = (unkuint10)(byte)(uVar85 >> 0x20) << 0x40;
  auVar77[10] = (char)(uVar85 >> 0x28);
  auVar80[0xb] = 0;
  auVar80._0_11_ = auVar77;
  auVar80[0xc] = (char)(uVar85 >> 0x30);
  auVar80[0xd] = 0;
  auVar80[0xe] = (char)(uVar85 >> 0x38);
  auVar83[3] = 0;
  auVar83._0_3_ = auVar77._8_3_;
  auVar83._4_3_ = auVar80._12_3_;
  auVar83[7] = 0;
  auVar83[0xb] = 0;
  auVar83._12_3_ =
       (int3)(CONCAT16((char)(uVar85 >> 0x18),(uint6)(byte)(uVar85 >> 0x10) << 0x20) >> 0x20);
  auVar83[0xf] = 0;
  auVar81 = pshuflw(auVar83,auVar83,0x1b);
  auVar81 = pshufhw(auVar81,auVar81,0x1b);
  sVar1 = auVar81._0_2_;
  sVar2 = auVar81._2_2_;
  sVar3 = auVar81._4_2_;
  sVar4 = auVar81._6_2_;
  sVar5 = auVar81._8_2_;
  sVar6 = auVar81._10_2_;
  sVar7 = auVar81._12_2_;
  sVar8 = auVar81._14_2_;
  sVar9 = auVar87._0_2_;
  sVar10 = auVar87._2_2_;
  sVar11 = auVar87._4_2_;
  sVar12 = auVar87._6_2_;
  sVar13 = auVar87._8_2_;
  sVar14 = auVar87._10_2_;
  sVar15 = auVar87._12_2_;
  sVar16 = auVar87._14_2_;
  *c = (0 < sVar1) * (sVar1 < 0x100) * auVar81[0] - (0xff < sVar1);
  c[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar81[2] - (0xff < sVar2);
  c[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar81[4] - (0xff < sVar3);
  c[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar81[6] - (0xff < sVar4);
  c[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar81[8] - (0xff < sVar5);
  c[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar81[10] - (0xff < sVar6);
  c[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar81[0xc] - (0xff < sVar7);
  c[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0xe] - (0xff < sVar8);
  c[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar87[0] - (0xff < sVar9);
  c[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar87[2] - (0xff < sVar10);
  c[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[4] - (0xff < sVar11);
  c[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar87[6] - (0xff < sVar12);
  c[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar87[8] - (0xff < sVar13);
  c[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar87[10] - (0xff < sVar14);
  c[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar87[0xc] - (0xff < sVar15);
  c[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar87[0xe] - (0xff < sVar16);
  return;
}

Assistant:

void mbedtls_aesni_gcm_mult( unsigned char c[16],
                     const unsigned char a[16],
                     const unsigned char b[16] )
{
    unsigned char aa[16], bb[16], cc[16];
    size_t i;

    /* The inputs are in big-endian order, so byte-reverse them */
    for( i = 0; i < 16; i++ )
    {
        aa[i] = a[15 - i];
        bb[i] = b[15 - i];
    }

    asm( "movdqu (%0), %%xmm0               \n\t" // a1:a0
         "movdqu (%1), %%xmm1               \n\t" // b1:b0

         /*
          * Caryless multiplication xmm2:xmm1 = xmm0 * xmm1
          * using [CLMUL-WP] algorithm 1 (p. 13).
          */
         "movdqa %%xmm1, %%xmm2             \n\t" // copy of b1:b0
         "movdqa %%xmm1, %%xmm3             \n\t" // same
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         PCLMULQDQ xmm0_xmm1 ",0x00         \n\t" // a0*b0 = c1:c0
         PCLMULQDQ xmm0_xmm2 ",0x11         \n\t" // a1*b1 = d1:d0
         PCLMULQDQ xmm0_xmm3 ",0x10         \n\t" // a0*b1 = e1:e0
         PCLMULQDQ xmm0_xmm4 ",0x01         \n\t" // a1*b0 = f1:f0
         "pxor %%xmm3, %%xmm4               \n\t" // e1+f1:e0+f0
         "movdqa %%xmm4, %%xmm3             \n\t" // same
         "psrldq $8, %%xmm4                 \n\t" // 0:e1+f1
         "pslldq $8, %%xmm3                 \n\t" // e0+f0:0
         "pxor %%xmm4, %%xmm2               \n\t" // d1:d0+e1+f1
         "pxor %%xmm3, %%xmm1               \n\t" // c1+e0+f1:c0

         /*
          * Now shift the result one bit to the left,
          * taking advantage of [CLMUL-WP] eq 27 (p. 20)
          */
         "movdqa %%xmm1, %%xmm3             \n\t" // r1:r0
         "movdqa %%xmm2, %%xmm4             \n\t" // r3:r2
         "psllq $1, %%xmm1                  \n\t" // r1<<1:r0<<1
         "psllq $1, %%xmm2                  \n\t" // r3<<1:r2<<1
         "psrlq $63, %%xmm3                 \n\t" // r1>>63:r0>>63
         "psrlq $63, %%xmm4                 \n\t" // r3>>63:r2>>63
         "movdqa %%xmm3, %%xmm5             \n\t" // r1>>63:r0>>63
         "pslldq $8, %%xmm3                 \n\t" // r0>>63:0
         "pslldq $8, %%xmm4                 \n\t" // r2>>63:0
         "psrldq $8, %%xmm5                 \n\t" // 0:r1>>63
         "por %%xmm3, %%xmm1                \n\t" // r1<<1|r0>>63:r0<<1
         "por %%xmm4, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1
         "por %%xmm5, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1|r1>>63

         /*
          * Now reduce modulo the GCM polynomial x^128 + x^7 + x^2 + x + 1
          * using [CLMUL-WP] algorithm 5 (p. 20).
          * Currently xmm2:xmm1 holds x3:x2:x1:x0 (already shifted).
          */
         /* Step 2 (1) */
         "movdqa %%xmm1, %%xmm3             \n\t" // x1:x0
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         "movdqa %%xmm1, %%xmm5             \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // x1<<63:x0<<63 = stuff:a
         "psllq $62, %%xmm4                 \n\t" // x1<<62:x0<<62 = stuff:b
         "psllq $57, %%xmm5                 \n\t" // x1<<57:x0<<57 = stuff:c

         /* Step 2 (2) */
         "pxor %%xmm4, %%xmm3               \n\t" // stuff:a+b
         "pxor %%xmm5, %%xmm3               \n\t" // stuff:a+b+c
         "pslldq $8, %%xmm3                 \n\t" // a+b+c:0
         "pxor %%xmm3, %%xmm1               \n\t" // x1+a+b+c:x0 = d:x0

         /* Steps 3 and 4 */
         "movdqa %%xmm1,%%xmm0              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psrlq $1, %%xmm0                  \n\t" // e1:x0>>1 = e1:e0'
         "psrlq $2, %%xmm4                  \n\t" // f1:x0>>2 = f1:f0'
         "psrlq $7, %%xmm5                  \n\t" // g1:x0>>7 = g1:g0'
         "pxor %%xmm4, %%xmm0               \n\t" // e1+f1:e0'+f0'
         "pxor %%xmm5, %%xmm0               \n\t" // e1+f1+g1:e0'+f0'+g0'
         // e0'+f0'+g0' is almost e0+f0+g0, ex\tcept for some missing
         // bits carried from d. Now get those\t bits back in.
         "movdqa %%xmm1,%%xmm3              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // d<<63:stuff
         "psllq $62, %%xmm4                 \n\t" // d<<62:stuff
         "psllq $57, %%xmm5                 \n\t" // d<<57:stuff
         "pxor %%xmm4, %%xmm3               \n\t" // d<<63+d<<62:stuff
         "pxor %%xmm5, %%xmm3               \n\t" // missing bits of d:stuff
         "psrldq $8, %%xmm3                 \n\t" // 0:missing bits of d
         "pxor %%xmm3, %%xmm0               \n\t" // e1+f1+g1:e0+f0+g0
         "pxor %%xmm1, %%xmm0               \n\t" // h1:h0
         "pxor %%xmm2, %%xmm0               \n\t" // x3+h1:x2+h0

         "movdqu %%xmm0, (%2)               \n\t" // done
         :
         : "r" (aa), "r" (bb), "r" (cc)
         : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5" );

    /* Now byte-reverse the outputs */
    for( i = 0; i < 16; i++ )
        c[i] = cc[15 - i];

    return;
}